

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

int __thiscall
program_options::command_line_parser::get_canonical_option_prefix(command_line_parser *this)

{
  command_line_parser *this_local;
  int local_4;
  
  if ((this->m_style & allow_long) == 0) {
    if ((this->m_style & allow_long_disguise) == 0) {
      if (((this->m_style & allow_short) == 0) || ((this->m_style & allow_dash_for_short) == 0)) {
        if (((this->m_style & allow_short) == 0) || ((this->m_style & allow_slash_for_short) == 0))
        {
          local_4 = 0;
        }
        else {
          local_4 = 8;
        }
      }
      else {
        local_4 = 4;
      }
    }
    else {
      local_4 = 0x1000;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int command_line_parser::get_canonical_option_prefix() const
{
    if (m_style & command_line_style::allow_long)
        return command_line_style::allow_long;

    if (m_style & command_line_style::allow_long_disguise)
        return command_line_style::allow_long_disguise;

    if ((m_style & command_line_style::allow_short) && (m_style & command_line_style::allow_dash_for_short))
        return command_line_style::allow_dash_for_short;

    if ((m_style & command_line_style::allow_short) && (m_style & command_line_style::allow_slash_for_short))
        return command_line_style::allow_slash_for_short;

    return 0;
}